

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall
ktxValidator::addIssue<char_const*>(ktxValidator *this,severity severity,issue *issue,char *args)

{
  undefined1 auStack_48 [40];
  
  ::issue::issue((issue *)auStack_48,issue);
  logger::addIssue<char_const*>(&this->logger,severity,(issue *)auStack_48,args);
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  return;
}

Assistant:

void addIssue(logger::severity severity, issue issue, Args ... args)
    {
        logger.addIssue(severity, issue, args...);
    }